

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_log.cpp
# Opt level: O2

void duckdb::ThrowIfNotConstant(Expression *arg)

{
  int iVar1;
  BinderException *this;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  iVar1 = (*(arg->super_BaseExpression)._vptr_BaseExpression[0xf])();
  if ((char)iVar1 != '\0') {
    return;
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"write_log: argument \'%s\' must be constant",&local_59);
  ::std::__cxx11::string::string((string *)&local_58,(string *)&(arg->super_BaseExpression).alias);
  BinderException::BinderException<std::__cxx11::string>(this,&local_38,&local_58);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void ThrowIfNotConstant(const Expression &arg) {
	if (!arg.IsFoldable()) {
		throw BinderException("write_log: argument '%s' must be constant", arg.alias);
	}
}